

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O0

int mask_contains(uint32_t *a,uint32_t *b,int size)

{
  int local_2c;
  int i;
  int rsize;
  int size_local;
  uint32_t *b_local;
  uint32_t *a_local;
  
  local_2c = 0;
  while( true ) {
    if ((size + 0x1f) / 0x20 <= local_2c) {
      return 1;
    }
    if ((a[local_2c] & b[local_2c]) != b[local_2c]) break;
    local_2c = local_2c + 1;
  }
  return 0;
}

Assistant:

int mask_contains(uint32_t *a, uint32_t *b, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	for (i = 0; i < rsize; i++)
		if ((a[i] & b[i]) != b[i]) {
			return 0;
		}
	return 1;
}